

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O1

int Test_SUNMatZero(SUNMatrix A,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar1 = SUNMatZero(A_00);
  sync_device(A_00);
  if (uVar1 == 0) {
    iVar2 = check_matrix_entry(A_00,0.0,2.220446049250313e-15);
    if (iVar2 == 0) {
      if (print_all_ranks == 0 && myid == 0) {
LAB_00101f3b:
        puts("    PASSED test -- SUNMatZero ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        goto LAB_00101f3b;
      }
      iVar2 = 0;
      if (myid != 0) goto LAB_00101f68;
    }
    else {
      if (print_all_ranks == 0 && myid == 0) {
LAB_00101f0d:
        puts(">>> FAILED test -- SUNMatZero check ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",myid);
        goto LAB_00101f0d;
      }
      iVar2 = 1;
    }
    if (print_time != 0) {
      printf("    SUNMatZero Time: %22.15e \n \n",0);
    }
    goto LAB_00101f68;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00101eba:
    printf(">>> FAILED test -- SUNMatZero returned %d \n",(ulong)uVar1);
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",myid);
    goto LAB_00101eba;
  }
  iVar2 = 1;
LAB_00101f68:
  SUNMatDestroy(A_00);
  return iVar2;
}

Assistant:

int Test_SUNMatZero(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;
  SUNMatrix B;

  /* protect A */
  B = SUNMatClone(A);

  /* set matrix data to zero */
  start_time = get_time();
  failure    = SUNMatZero(B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatZero returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* A data should be a vector of zeros */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatZero check \n", myid);
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatZero \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatZero Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}